

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TemplateTest.hpp
# Opt level: O3

void Qentem::Test::TestVariableTag4(QTest *test)

{
  QNumber64 QVar1;
  undefined4 uVar2;
  QTest *this;
  char *pcVar3;
  Value<char> *this_00;
  Array<Qentem::Tags::TagBit> tags_cache;
  Value<char> value;
  StringStream<char> ss;
  QNumber64 local_a8;
  ulong uStack_a0;
  anon_union_16_5_5c8fea6c_for_Value<char>_1 local_98;
  char local_88;
  anon_union_16_5_5c8fea6c_for_Value<char>_1 local_78;
  undefined8 local_68;
  char *local_60;
  undefined4 local_58;
  QTest *local_50;
  StringStream<char> local_48;
  
  local_88 = '\0';
  local_48.storage_ = (char *)0x0;
  local_48.length_ = 0;
  local_48.capacity_ = 0;
  local_98.array_.storage_ = (Value<char> *)0x0;
  local_98._8_8_ = 0;
  local_50 = test;
  String<char>::String((String<char> *)&local_a8,"<");
  if (local_88 != '\x03') {
    Value<char>::reset((Value<char> *)&local_98.array_);
    local_88 = '\x03';
  }
  local_78.array_.storage_ = (Value<char> *)local_a8;
  local_78.array_.index_ = (undefined4)uStack_a0;
  uStack_a0 = uStack_a0 & 0xffffffff00000000;
  local_a8.Natural = 0;
  local_68 = CONCAT71(local_68._1_7_,4);
  Array<Qentem::Value<char>_>::operator+=(&local_98.array_,(Value<char> *)&local_78.array_);
  Value<char>::~Value((Value<char> *)&local_78.array_);
  QVar1 = local_a8;
  if ((void *)local_a8.Natural != (void *)0x0) {
    MemoryRecord::RemoveAllocation((void *)local_a8);
  }
  operator_delete((void *)QVar1);
  String<char>::String((String<char> *)&local_a8,">");
  if (local_88 != '\x03') {
    Value<char>::reset((Value<char> *)&local_98.array_);
    local_88 = '\x03';
  }
  local_78.number_ = local_a8;
  uVar2 = (undefined4)uStack_a0;
  uStack_a0 = uStack_a0 & 0xffffffff00000000;
  local_a8.Natural = 0;
  local_78.array_.index_ = uVar2;
  local_68 = CONCAT71(local_68._1_7_,4);
  Array<Qentem::Value<char>_>::operator+=(&local_98.array_,(Value<char> *)&local_78.array_);
  Value<char>::~Value((Value<char> *)&local_78.array_);
  QVar1 = local_a8;
  if ((void *)local_a8.Natural != (void *)0x0) {
    MemoryRecord::RemoveAllocation((void *)local_a8);
  }
  operator_delete((void *)QVar1);
  String<char>::String((String<char> *)&local_a8,"&");
  if (local_88 != '\x03') {
    Value<char>::reset((Value<char> *)&local_98.array_);
    local_88 = '\x03';
  }
  local_78.number_ = local_a8;
  uVar2 = (undefined4)uStack_a0;
  uStack_a0 = uStack_a0 & 0xffffffff00000000;
  local_a8.Natural = 0;
  local_78.array_.index_ = uVar2;
  local_68 = CONCAT71(local_68._1_7_,4);
  Array<Qentem::Value<char>_>::operator+=(&local_98.array_,(Value<char> *)&local_78.array_);
  Value<char>::~Value((Value<char> *)&local_78.array_);
  QVar1 = local_a8;
  if ((void *)local_a8.Natural != (void *)0x0) {
    MemoryRecord::RemoveAllocation((void *)local_a8);
  }
  operator_delete((void *)QVar1);
  String<char>::String((String<char> *)&local_a8,"\"");
  if (local_88 != '\x03') {
    Value<char>::reset((Value<char> *)&local_98.array_);
    local_88 = '\x03';
  }
  local_78.number_ = local_a8;
  uVar2 = (undefined4)uStack_a0;
  uStack_a0 = uStack_a0 & 0xffffffff00000000;
  local_a8.Natural = 0;
  local_78.array_.index_ = uVar2;
  local_68 = CONCAT71(local_68._1_7_,4);
  Array<Qentem::Value<char>_>::operator+=(&local_98.array_,(Value<char> *)&local_78.array_);
  Value<char>::~Value((Value<char> *)&local_78.array_);
  QVar1 = local_a8;
  if ((void *)local_a8.Natural != (void *)0x0) {
    MemoryRecord::RemoveAllocation((void *)local_a8);
  }
  operator_delete((void *)QVar1);
  String<char>::String((String<char> *)&local_a8,"\'");
  if (local_88 != '\x03') {
    Value<char>::reset((Value<char> *)&local_98.array_);
    local_88 = '\x03';
  }
  local_78.number_ = local_a8;
  uVar2 = (undefined4)uStack_a0;
  uStack_a0 = uStack_a0 & 0xffffffff00000000;
  local_a8.Natural = 0;
  local_78.array_.index_ = uVar2;
  local_68 = CONCAT71(local_68._1_7_,4);
  Array<Qentem::Value<char>_>::operator+=(&local_98.array_,(Value<char> *)&local_78.array_);
  Value<char>::~Value((Value<char> *)&local_78.array_);
  QVar1 = local_a8;
  if ((void *)local_a8.Natural != (void *)0x0) {
    MemoryRecord::RemoveAllocation((void *)local_a8);
  }
  operator_delete((void *)QVar1);
  String<char>::String((String<char> *)&local_a8,"<>");
  if (local_88 != '\x03') {
    Value<char>::reset((Value<char> *)&local_98.array_);
    local_88 = '\x03';
  }
  local_78.number_ = local_a8;
  uVar2 = (undefined4)uStack_a0;
  uStack_a0 = uStack_a0 & 0xffffffff00000000;
  local_a8.Natural = 0;
  local_78.array_.index_ = uVar2;
  local_68 = CONCAT71(local_68._1_7_,4);
  Array<Qentem::Value<char>_>::operator+=(&local_98.array_,(Value<char> *)&local_78.array_);
  Value<char>::~Value((Value<char> *)&local_78.array_);
  QVar1 = local_a8;
  if ((void *)local_a8.Natural != (void *)0x0) {
    MemoryRecord::RemoveAllocation((void *)local_a8);
  }
  operator_delete((void *)QVar1);
  String<char>::String((String<char> *)&local_a8,"<&");
  if (local_88 != '\x03') {
    Value<char>::reset((Value<char> *)&local_98.array_);
    local_88 = '\x03';
  }
  local_78.number_ = local_a8;
  uVar2 = (undefined4)uStack_a0;
  uStack_a0 = uStack_a0 & 0xffffffff00000000;
  local_a8.Natural = 0;
  local_78.array_.index_ = uVar2;
  local_68 = CONCAT71(local_68._1_7_,4);
  Array<Qentem::Value<char>_>::operator+=(&local_98.array_,(Value<char> *)&local_78.array_);
  Value<char>::~Value((Value<char> *)&local_78.array_);
  QVar1 = local_a8;
  if ((void *)local_a8.Natural != (void *)0x0) {
    MemoryRecord::RemoveAllocation((void *)local_a8);
  }
  operator_delete((void *)QVar1);
  String<char>::String((String<char> *)&local_a8,"<&");
  if (local_88 != '\x03') {
    Value<char>::reset((Value<char> *)&local_98.array_);
    local_88 = '\x03';
  }
  local_78.number_ = local_a8;
  uVar2 = (undefined4)uStack_a0;
  uStack_a0 = uStack_a0 & 0xffffffff00000000;
  local_a8.Natural = 0;
  local_78.array_.index_ = uVar2;
  local_68 = CONCAT71(local_68._1_7_,4);
  Array<Qentem::Value<char>_>::operator+=(&local_98.array_,(Value<char> *)&local_78.array_);
  Value<char>::~Value((Value<char> *)&local_78.array_);
  QVar1 = local_a8;
  if ((void *)local_a8.Natural != (void *)0x0) {
    MemoryRecord::RemoveAllocation((void *)local_a8);
  }
  operator_delete((void *)QVar1);
  String<char>::String((String<char> *)&local_a8,">\"");
  if (local_88 != '\x03') {
    Value<char>::reset((Value<char> *)&local_98.array_);
    local_88 = '\x03';
  }
  local_78.number_ = local_a8;
  uVar2 = (undefined4)uStack_a0;
  uStack_a0 = uStack_a0 & 0xffffffff00000000;
  local_a8.Natural = 0;
  local_78.array_.index_ = uVar2;
  local_68 = CONCAT71(local_68._1_7_,4);
  Array<Qentem::Value<char>_>::operator+=(&local_98.array_,(Value<char> *)&local_78.array_);
  Value<char>::~Value((Value<char> *)&local_78.array_);
  QVar1 = local_a8;
  if ((void *)local_a8.Natural != (void *)0x0) {
    MemoryRecord::RemoveAllocation((void *)local_a8);
  }
  operator_delete((void *)QVar1);
  String<char>::String((String<char> *)&local_a8,"\"\'");
  if (local_88 != '\x03') {
    Value<char>::reset((Value<char> *)&local_98.array_);
    local_88 = '\x03';
  }
  local_78.number_ = local_a8;
  uVar2 = (undefined4)uStack_a0;
  uStack_a0 = uStack_a0 & 0xffffffff00000000;
  local_a8.Natural = 0;
  local_78.array_.index_ = uVar2;
  local_68 = CONCAT71(local_68._1_7_,4);
  Array<Qentem::Value<char>_>::operator+=(&local_98.array_,(Value<char> *)&local_78.array_);
  Value<char>::~Value((Value<char> *)&local_78.array_);
  QVar1 = local_a8;
  if ((void *)local_a8.Natural != (void *)0x0) {
    MemoryRecord::RemoveAllocation((void *)local_a8);
  }
  operator_delete((void *)QVar1);
  String<char>::String((String<char> *)&local_a8,"<\">");
  if (local_88 != '\x03') {
    Value<char>::reset((Value<char> *)&local_98.array_);
    local_88 = '\x03';
  }
  local_78.number_ = local_a8;
  uVar2 = (undefined4)uStack_a0;
  uStack_a0 = uStack_a0 & 0xffffffff00000000;
  local_a8.Natural = 0;
  local_78.array_.index_ = uVar2;
  local_68 = CONCAT71(local_68._1_7_,4);
  Array<Qentem::Value<char>_>::operator+=(&local_98.array_,(Value<char> *)&local_78.array_);
  Value<char>::~Value((Value<char> *)&local_78.array_);
  QVar1 = local_a8;
  if ((void *)local_a8.Natural != (void *)0x0) {
    MemoryRecord::RemoveAllocation((void *)local_a8);
  }
  operator_delete((void *)QVar1);
  String<char>::String((String<char> *)&local_a8,"<\'>");
  if (local_88 != '\x03') {
    Value<char>::reset((Value<char> *)&local_98.array_);
    local_88 = '\x03';
  }
  local_78.number_ = local_a8;
  uVar2 = (undefined4)uStack_a0;
  uStack_a0 = uStack_a0 & 0xffffffff00000000;
  local_a8.Natural = 0;
  local_78.array_.index_ = uVar2;
  local_68 = CONCAT71(local_68._1_7_,4);
  Array<Qentem::Value<char>_>::operator+=(&local_98.array_,(Value<char> *)&local_78.array_);
  Value<char>::~Value((Value<char> *)&local_78.array_);
  QVar1 = local_a8;
  if ((void *)local_a8.Natural != (void *)0x0) {
    MemoryRecord::RemoveAllocation((void *)local_a8);
  }
  operator_delete((void *)QVar1);
  String<char>::String((String<char> *)&local_a8,"<&>");
  if (local_88 != '\x03') {
    Value<char>::reset((Value<char> *)&local_98.array_);
    local_88 = '\x03';
  }
  local_78.number_ = local_a8;
  uVar2 = (undefined4)uStack_a0;
  uStack_a0 = uStack_a0 & 0xffffffff00000000;
  local_a8.Natural = 0;
  local_78.array_.index_ = uVar2;
  local_68 = CONCAT71(local_68._1_7_,4);
  Array<Qentem::Value<char>_>::operator+=(&local_98.array_,(Value<char> *)&local_78.array_);
  Value<char>::~Value((Value<char> *)&local_78.array_);
  QVar1 = local_a8;
  if ((void *)local_a8.Natural != (void *)0x0) {
    MemoryRecord::RemoveAllocation((void *)local_a8);
  }
  operator_delete((void *)QVar1);
  String<char>::String((String<char> *)&local_a8,"&\"&");
  if (local_88 != '\x03') {
    Value<char>::reset((Value<char> *)&local_98.array_);
    local_88 = '\x03';
  }
  local_78.number_ = local_a8;
  uVar2 = (undefined4)uStack_a0;
  uStack_a0 = uStack_a0 & 0xffffffff00000000;
  local_a8.Natural = 0;
  local_78.array_.index_ = uVar2;
  local_68 = CONCAT71(local_68._1_7_,4);
  Array<Qentem::Value<char>_>::operator+=(&local_98.array_,(Value<char> *)&local_78.array_);
  Value<char>::~Value((Value<char> *)&local_78.array_);
  QVar1 = local_a8;
  if ((void *)local_a8.Natural != (void *)0x0) {
    MemoryRecord::RemoveAllocation((void *)local_a8);
  }
  operator_delete((void *)QVar1);
  String<char>::String((String<char> *)&local_a8,"\"\'\"");
  if (local_88 != '\x03') {
    Value<char>::reset((Value<char> *)&local_98.array_);
    local_88 = '\x03';
  }
  local_78.number_ = local_a8;
  uVar2 = (undefined4)uStack_a0;
  uStack_a0 = uStack_a0 & 0xffffffff00000000;
  local_a8.Natural = 0;
  local_78.array_.index_ = uVar2;
  local_68 = CONCAT71(local_68._1_7_,4);
  Array<Qentem::Value<char>_>::operator+=(&local_98.array_,(Value<char> *)&local_78.array_);
  Value<char>::~Value((Value<char> *)&local_78.array_);
  QVar1 = local_a8;
  if ((void *)local_a8.Natural != (void *)0x0) {
    MemoryRecord::RemoveAllocation((void *)local_a8);
  }
  operator_delete((void *)QVar1);
  String<char>::String((String<char> *)&local_a8,"\'<\'");
  if (local_88 != '\x03') {
    Value<char>::reset((Value<char> *)&local_98.array_);
    local_88 = '\x03';
  }
  local_78.number_ = local_a8;
  uVar2 = (undefined4)uStack_a0;
  uStack_a0 = uStack_a0 & 0xffffffff00000000;
  local_a8.Natural = 0;
  local_78.array_.index_ = uVar2;
  local_68 = CONCAT71(local_68._1_7_,4);
  Array<Qentem::Value<char>_>::operator+=(&local_98.array_,(Value<char> *)&local_78.array_);
  Value<char>::~Value((Value<char> *)&local_78.array_);
  QVar1 = local_a8;
  if ((void *)local_a8.Natural != (void *)0x0) {
    MemoryRecord::RemoveAllocation((void *)local_a8);
  }
  operator_delete((void *)QVar1);
  String<char>::String((String<char> *)&local_a8,"\'&\'");
  if (local_88 != '\x03') {
    Value<char>::reset((Value<char> *)&local_98.array_);
    local_88 = '\x03';
  }
  local_78.number_ = local_a8;
  uVar2 = (undefined4)uStack_a0;
  uStack_a0 = uStack_a0 & 0xffffffff00000000;
  local_a8.Natural = 0;
  local_78.array_.index_ = uVar2;
  local_68 = CONCAT71(local_68._1_7_,4);
  Array<Qentem::Value<char>_>::operator+=(&local_98.array_,(Value<char> *)&local_78.array_);
  Value<char>::~Value((Value<char> *)&local_78.array_);
  QVar1 = local_a8;
  if ((void *)local_a8.Natural != (void *)0x0) {
    MemoryRecord::RemoveAllocation((void *)local_a8);
  }
  operator_delete((void *)QVar1);
  String<char>::String((String<char> *)&local_a8,"<>&\'\"");
  if (local_88 != '\x03') {
    Value<char>::reset((Value<char> *)&local_98.array_);
    local_88 = '\x03';
  }
  local_78.number_ = local_a8;
  uVar2 = (undefined4)uStack_a0;
  uStack_a0 = uStack_a0 & 0xffffffff00000000;
  local_a8.Natural = 0;
  local_78.array_.index_ = uVar2;
  local_68 = CONCAT71(local_68._1_7_,4);
  Array<Qentem::Value<char>_>::operator+=(&local_98.array_,(Value<char> *)&local_78.array_);
  Value<char>::~Value((Value<char> *)&local_78.array_);
  QVar1 = local_a8;
  if ((void *)local_a8.Natural != (void *)0x0) {
    MemoryRecord::RemoveAllocation((void *)local_a8);
  }
  operator_delete((void *)QVar1);
  String<char>::String((String<char> *)&local_a8,"\'\"<>&");
  if (local_88 != '\x03') {
    Value<char>::reset((Value<char> *)&local_98.array_);
    local_88 = '\x03';
  }
  local_78.number_ = local_a8;
  uVar2 = (undefined4)uStack_a0;
  uStack_a0 = uStack_a0 & 0xffffffff00000000;
  local_a8.Natural = 0;
  local_78.array_.index_ = uVar2;
  local_68 = CONCAT71(local_68._1_7_,4);
  Array<Qentem::Value<char>_>::operator+=(&local_98.array_,(Value<char> *)&local_78.array_);
  Value<char>::~Value((Value<char> *)&local_78.array_);
  QVar1 = local_a8;
  if ((void *)local_a8.Natural != (void *)0x0) {
    MemoryRecord::RemoveAllocation((void *)local_a8);
  }
  operator_delete((void *)QVar1);
  String<char>::String((String<char> *)&local_a8,"<\"&\'>");
  if (local_88 != '\x03') {
    Value<char>::reset((Value<char> *)&local_98.array_);
    local_88 = '\x03';
  }
  local_78.number_ = local_a8;
  uVar2 = (undefined4)uStack_a0;
  uStack_a0 = uStack_a0 & 0xffffffff00000000;
  local_a8.Natural = 0;
  local_78.array_.index_ = uVar2;
  local_68 = CONCAT71(local_68._1_7_,4);
  Array<Qentem::Value<char>_>::operator+=(&local_98.array_,(Value<char> *)&local_78.array_);
  Value<char>::~Value((Value<char> *)&local_78.array_);
  QVar1 = local_a8;
  if ((void *)local_a8.Natural != (void *)0x0) {
    MemoryRecord::RemoveAllocation((void *)local_a8);
  }
  operator_delete((void *)QVar1);
  String<char>::String((String<char> *)&local_a8,"<<<<<");
  if (local_88 != '\x03') {
    Value<char>::reset((Value<char> *)&local_98.array_);
    local_88 = '\x03';
  }
  local_78.number_ = local_a8;
  uVar2 = (undefined4)uStack_a0;
  uStack_a0 = uStack_a0 & 0xffffffff00000000;
  local_a8.Natural = 0;
  local_78.array_.index_ = uVar2;
  local_68 = CONCAT71(local_68._1_7_,4);
  Array<Qentem::Value<char>_>::operator+=(&local_98.array_,(Value<char> *)&local_78.array_);
  Value<char>::~Value((Value<char> *)&local_78.array_);
  QVar1 = local_a8;
  if ((void *)local_a8.Natural != (void *)0x0) {
    MemoryRecord::RemoveAllocation((void *)local_a8);
  }
  operator_delete((void *)QVar1);
  String<char>::String((String<char> *)&local_a8,">>>>>");
  if (local_88 != '\x03') {
    Value<char>::reset((Value<char> *)&local_98.array_);
    local_88 = '\x03';
  }
  local_78.number_ = local_a8;
  uVar2 = (undefined4)uStack_a0;
  uStack_a0 = uStack_a0 & 0xffffffff00000000;
  local_a8.Natural = 0;
  local_78.array_.index_ = uVar2;
  local_68 = CONCAT71(local_68._1_7_,4);
  Array<Qentem::Value<char>_>::operator+=(&local_98.array_,(Value<char> *)&local_78.array_);
  Value<char>::~Value((Value<char> *)&local_78.array_);
  QVar1 = local_a8;
  if ((void *)local_a8.Natural != (void *)0x0) {
    MemoryRecord::RemoveAllocation((void *)local_a8);
  }
  operator_delete((void *)QVar1);
  String<char>::String((String<char> *)&local_a8,"&&&&&");
  if (local_88 != '\x03') {
    Value<char>::reset((Value<char> *)&local_98.array_);
    local_88 = '\x03';
  }
  local_78.number_ = local_a8;
  uVar2 = (undefined4)uStack_a0;
  uStack_a0 = uStack_a0 & 0xffffffff00000000;
  local_a8.Natural = 0;
  local_78.array_.index_ = uVar2;
  local_68 = CONCAT71(local_68._1_7_,4);
  Array<Qentem::Value<char>_>::operator+=(&local_98.array_,(Value<char> *)&local_78.array_);
  Value<char>::~Value((Value<char> *)&local_78.array_);
  QVar1 = local_a8;
  if ((void *)local_a8.Natural != (void *)0x0) {
    MemoryRecord::RemoveAllocation((void *)local_a8);
  }
  operator_delete((void *)QVar1);
  String<char>::String((String<char> *)&local_a8,"\"\"\"\"\"");
  if (local_88 != '\x03') {
    Value<char>::reset((Value<char> *)&local_98.array_);
    local_88 = '\x03';
  }
  local_78.number_ = local_a8;
  uVar2 = (undefined4)uStack_a0;
  uStack_a0 = uStack_a0 & 0xffffffff00000000;
  local_a8.Natural = 0;
  local_78.array_.index_ = uVar2;
  local_68 = CONCAT71(local_68._1_7_,4);
  Array<Qentem::Value<char>_>::operator+=(&local_98.array_,(Value<char> *)&local_78.array_);
  Value<char>::~Value((Value<char> *)&local_78.array_);
  QVar1 = local_a8;
  if ((void *)local_a8.Natural != (void *)0x0) {
    MemoryRecord::RemoveAllocation((void *)local_a8);
  }
  operator_delete((void *)QVar1);
  String<char>::String((String<char> *)&local_a8,"\'\'\'\'\'");
  if (local_88 != '\x03') {
    Value<char>::reset((Value<char> *)&local_98.array_);
    local_88 = '\x03';
  }
  local_78.number_ = local_a8;
  uVar2 = (undefined4)uStack_a0;
  uStack_a0 = uStack_a0 & 0xffffffff00000000;
  local_a8.Natural = 0;
  local_78.array_.index_ = uVar2;
  local_68 = CONCAT71(local_68._1_7_,4);
  Array<Qentem::Value<char>_>::operator+=(&local_98.array_,(Value<char> *)&local_78.array_);
  Value<char>::~Value((Value<char> *)&local_78.array_);
  QVar1 = local_a8;
  if ((void *)local_a8.Natural != (void *)0x0) {
    MemoryRecord::RemoveAllocation((void *)local_a8);
  }
  operator_delete((void *)QVar1);
  String<char>::String((String<char> *)&local_a8,"A<");
  if (local_88 != '\x03') {
    Value<char>::reset((Value<char> *)&local_98.array_);
    local_88 = '\x03';
  }
  local_78.number_ = local_a8;
  uVar2 = (undefined4)uStack_a0;
  uStack_a0 = uStack_a0 & 0xffffffff00000000;
  local_a8.Natural = 0;
  local_78.array_.index_ = uVar2;
  local_68 = CONCAT71(local_68._1_7_,4);
  Array<Qentem::Value<char>_>::operator+=(&local_98.array_,(Value<char> *)&local_78.array_);
  Value<char>::~Value((Value<char> *)&local_78.array_);
  QVar1 = local_a8;
  if ((void *)local_a8.Natural != (void *)0x0) {
    MemoryRecord::RemoveAllocation((void *)local_a8);
  }
  operator_delete((void *)QVar1);
  String<char>::String((String<char> *)&local_a8,"A>");
  if (local_88 != '\x03') {
    Value<char>::reset((Value<char> *)&local_98.array_);
    local_88 = '\x03';
  }
  local_78.number_ = local_a8;
  uVar2 = (undefined4)uStack_a0;
  uStack_a0 = uStack_a0 & 0xffffffff00000000;
  local_a8.Natural = 0;
  local_78.array_.index_ = uVar2;
  local_68 = CONCAT71(local_68._1_7_,4);
  Array<Qentem::Value<char>_>::operator+=(&local_98.array_,(Value<char> *)&local_78.array_);
  Value<char>::~Value((Value<char> *)&local_78.array_);
  QVar1 = local_a8;
  if ((void *)local_a8.Natural != (void *)0x0) {
    MemoryRecord::RemoveAllocation((void *)local_a8);
  }
  operator_delete((void *)QVar1);
  String<char>::String((String<char> *)&local_a8,"A&");
  if (local_88 != '\x03') {
    Value<char>::reset((Value<char> *)&local_98.array_);
    local_88 = '\x03';
  }
  local_78.number_ = local_a8;
  uVar2 = (undefined4)uStack_a0;
  uStack_a0 = uStack_a0 & 0xffffffff00000000;
  local_a8.Natural = 0;
  local_78.array_.index_ = uVar2;
  local_68 = CONCAT71(local_68._1_7_,4);
  Array<Qentem::Value<char>_>::operator+=(&local_98.array_,(Value<char> *)&local_78.array_);
  Value<char>::~Value((Value<char> *)&local_78.array_);
  QVar1 = local_a8;
  if ((void *)local_a8.Natural != (void *)0x0) {
    MemoryRecord::RemoveAllocation((void *)local_a8);
  }
  operator_delete((void *)QVar1);
  String<char>::String((String<char> *)&local_a8,"A\"");
  if (local_88 != '\x03') {
    Value<char>::reset((Value<char> *)&local_98.array_);
    local_88 = '\x03';
  }
  local_78.number_ = local_a8;
  uVar2 = (undefined4)uStack_a0;
  uStack_a0 = uStack_a0 & 0xffffffff00000000;
  local_a8.Natural = 0;
  local_78.array_.index_ = uVar2;
  local_68 = CONCAT71(local_68._1_7_,4);
  Array<Qentem::Value<char>_>::operator+=(&local_98.array_,(Value<char> *)&local_78.array_);
  Value<char>::~Value((Value<char> *)&local_78.array_);
  QVar1 = local_a8;
  if ((void *)local_a8.Natural != (void *)0x0) {
    MemoryRecord::RemoveAllocation((void *)local_a8);
  }
  operator_delete((void *)QVar1);
  String<char>::String((String<char> *)&local_a8,"A\'");
  if (local_88 != '\x03') {
    Value<char>::reset((Value<char> *)&local_98.array_);
    local_88 = '\x03';
  }
  local_78.number_ = local_a8;
  uVar2 = (undefined4)uStack_a0;
  uStack_a0 = uStack_a0 & 0xffffffff00000000;
  local_a8.Natural = 0;
  local_78.array_.index_ = uVar2;
  local_68 = CONCAT71(local_68._1_7_,4);
  Array<Qentem::Value<char>_>::operator+=(&local_98.array_,(Value<char> *)&local_78.array_);
  Value<char>::~Value((Value<char> *)&local_78.array_);
  QVar1 = local_a8;
  if ((void *)local_a8.Natural != (void *)0x0) {
    MemoryRecord::RemoveAllocation((void *)local_a8);
  }
  operator_delete((void *)QVar1);
  String<char>::String((String<char> *)&local_a8,"<A");
  if (local_88 != '\x03') {
    Value<char>::reset((Value<char> *)&local_98.array_);
    local_88 = '\x03';
  }
  local_78.number_ = local_a8;
  uVar2 = (undefined4)uStack_a0;
  uStack_a0 = uStack_a0 & 0xffffffff00000000;
  local_a8.Natural = 0;
  local_78.array_.index_ = uVar2;
  local_68 = CONCAT71(local_68._1_7_,4);
  Array<Qentem::Value<char>_>::operator+=(&local_98.array_,(Value<char> *)&local_78.array_);
  Value<char>::~Value((Value<char> *)&local_78.array_);
  QVar1 = local_a8;
  if ((void *)local_a8.Natural != (void *)0x0) {
    MemoryRecord::RemoveAllocation((void *)local_a8);
  }
  operator_delete((void *)QVar1);
  String<char>::String((String<char> *)&local_a8,">A");
  if (local_88 != '\x03') {
    Value<char>::reset((Value<char> *)&local_98.array_);
    local_88 = '\x03';
  }
  local_78.number_ = local_a8;
  uVar2 = (undefined4)uStack_a0;
  uStack_a0 = uStack_a0 & 0xffffffff00000000;
  local_a8.Natural = 0;
  local_78.array_.index_ = uVar2;
  local_68 = CONCAT71(local_68._1_7_,4);
  Array<Qentem::Value<char>_>::operator+=(&local_98.array_,(Value<char> *)&local_78.array_);
  Value<char>::~Value((Value<char> *)&local_78.array_);
  QVar1 = local_a8;
  if ((void *)local_a8.Natural != (void *)0x0) {
    MemoryRecord::RemoveAllocation((void *)local_a8);
  }
  operator_delete((void *)QVar1);
  String<char>::String((String<char> *)&local_a8,"&A");
  if (local_88 != '\x03') {
    Value<char>::reset((Value<char> *)&local_98.array_);
    local_88 = '\x03';
  }
  local_78.number_ = local_a8;
  uVar2 = (undefined4)uStack_a0;
  uStack_a0 = uStack_a0 & 0xffffffff00000000;
  local_a8.Natural = 0;
  local_78.array_.index_ = uVar2;
  local_68 = CONCAT71(local_68._1_7_,4);
  Array<Qentem::Value<char>_>::operator+=(&local_98.array_,(Value<char> *)&local_78.array_);
  Value<char>::~Value((Value<char> *)&local_78.array_);
  QVar1 = local_a8;
  if ((void *)local_a8.Natural != (void *)0x0) {
    MemoryRecord::RemoveAllocation((void *)local_a8);
  }
  operator_delete((void *)QVar1);
  String<char>::String((String<char> *)&local_a8,"\"A");
  if (local_88 != '\x03') {
    Value<char>::reset((Value<char> *)&local_98.array_);
    local_88 = '\x03';
  }
  local_78.number_ = local_a8;
  uVar2 = (undefined4)uStack_a0;
  uStack_a0 = uStack_a0 & 0xffffffff00000000;
  local_a8.Natural = 0;
  local_78.array_.index_ = uVar2;
  local_68 = CONCAT71(local_68._1_7_,4);
  Array<Qentem::Value<char>_>::operator+=(&local_98.array_,(Value<char> *)&local_78.array_);
  Value<char>::~Value((Value<char> *)&local_78.array_);
  QVar1 = local_a8;
  if ((void *)local_a8.Natural != (void *)0x0) {
    MemoryRecord::RemoveAllocation((void *)local_a8);
  }
  operator_delete((void *)QVar1);
  String<char>::String((String<char> *)&local_a8,"\'A");
  if (local_88 != '\x03') {
    Value<char>::reset((Value<char> *)&local_98.array_);
    local_88 = '\x03';
  }
  local_78.number_ = local_a8;
  uVar2 = (undefined4)uStack_a0;
  uStack_a0 = uStack_a0 & 0xffffffff00000000;
  local_a8.Natural = 0;
  local_78.array_.index_ = uVar2;
  local_68 = CONCAT71(local_68._1_7_,4);
  Array<Qentem::Value<char>_>::operator+=(&local_98.array_,(Value<char> *)&local_78.array_);
  Value<char>::~Value((Value<char> *)&local_78.array_);
  QVar1 = local_a8;
  if ((void *)local_a8.Natural != (void *)0x0) {
    MemoryRecord::RemoveAllocation((void *)local_a8);
  }
  operator_delete((void *)QVar1);
  String<char>::String((String<char> *)&local_a8,"A<A");
  if (local_88 != '\x03') {
    Value<char>::reset((Value<char> *)&local_98.array_);
    local_88 = '\x03';
  }
  local_78.number_ = local_a8;
  uVar2 = (undefined4)uStack_a0;
  uStack_a0 = uStack_a0 & 0xffffffff00000000;
  local_a8.Natural = 0;
  local_78.array_.index_ = uVar2;
  local_68 = CONCAT71(local_68._1_7_,4);
  Array<Qentem::Value<char>_>::operator+=(&local_98.array_,(Value<char> *)&local_78.array_);
  Value<char>::~Value((Value<char> *)&local_78.array_);
  QVar1 = local_a8;
  if ((void *)local_a8.Natural != (void *)0x0) {
    MemoryRecord::RemoveAllocation((void *)local_a8);
  }
  operator_delete((void *)QVar1);
  String<char>::String((String<char> *)&local_a8,"A>A");
  if (local_88 != '\x03') {
    Value<char>::reset((Value<char> *)&local_98.array_);
    local_88 = '\x03';
  }
  local_78.number_ = local_a8;
  uVar2 = (undefined4)uStack_a0;
  uStack_a0 = uStack_a0 & 0xffffffff00000000;
  local_a8.Natural = 0;
  local_78.array_.index_ = uVar2;
  local_68 = CONCAT71(local_68._1_7_,4);
  Array<Qentem::Value<char>_>::operator+=(&local_98.array_,(Value<char> *)&local_78.array_);
  Value<char>::~Value((Value<char> *)&local_78.array_);
  QVar1 = local_a8;
  if ((void *)local_a8.Natural != (void *)0x0) {
    MemoryRecord::RemoveAllocation((void *)local_a8);
  }
  operator_delete((void *)QVar1);
  String<char>::String((String<char> *)&local_a8,"A&A");
  if (local_88 != '\x03') {
    Value<char>::reset((Value<char> *)&local_98.array_);
    local_88 = '\x03';
  }
  local_78.number_ = local_a8;
  uVar2 = (undefined4)uStack_a0;
  uStack_a0 = uStack_a0 & 0xffffffff00000000;
  local_a8.Natural = 0;
  local_78.array_.index_ = uVar2;
  local_68 = CONCAT71(local_68._1_7_,4);
  Array<Qentem::Value<char>_>::operator+=(&local_98.array_,(Value<char> *)&local_78.array_);
  Value<char>::~Value((Value<char> *)&local_78.array_);
  QVar1 = local_a8;
  if ((void *)local_a8.Natural != (void *)0x0) {
    MemoryRecord::RemoveAllocation((void *)local_a8);
  }
  operator_delete((void *)QVar1);
  String<char>::String((String<char> *)&local_a8,"A\"A");
  if (local_88 != '\x03') {
    Value<char>::reset((Value<char> *)&local_98.array_);
    local_88 = '\x03';
  }
  local_78.number_ = local_a8;
  uVar2 = (undefined4)uStack_a0;
  uStack_a0 = uStack_a0 & 0xffffffff00000000;
  local_a8.Natural = 0;
  local_78.array_.index_ = uVar2;
  local_68 = CONCAT71(local_68._1_7_,4);
  Array<Qentem::Value<char>_>::operator+=(&local_98.array_,(Value<char> *)&local_78.array_);
  Value<char>::~Value((Value<char> *)&local_78.array_);
  QVar1 = local_a8;
  if ((void *)local_a8.Natural != (void *)0x0) {
    MemoryRecord::RemoveAllocation((void *)local_a8);
  }
  operator_delete((void *)QVar1);
  String<char>::String((String<char> *)&local_a8,"A\'A");
  if (local_88 != '\x03') {
    Value<char>::reset((Value<char> *)&local_98.array_);
    local_88 = '\x03';
  }
  local_78.number_ = local_a8;
  uVar2 = (undefined4)uStack_a0;
  uStack_a0 = uStack_a0 & 0xffffffff00000000;
  local_a8.Natural = 0;
  local_78.array_.index_ = uVar2;
  local_68 = CONCAT71(local_68._1_7_,4);
  Array<Qentem::Value<char>_>::operator+=(&local_98.array_,(Value<char> *)&local_78.array_);
  Value<char>::~Value((Value<char> *)&local_78.array_);
  QVar1 = local_a8;
  if ((void *)local_a8.Natural != (void *)0x0) {
    MemoryRecord::RemoveAllocation((void *)local_a8);
  }
  operator_delete((void *)QVar1);
  String<char>::String((String<char> *)&local_a8,"AA<AA");
  if (local_88 != '\x03') {
    Value<char>::reset((Value<char> *)&local_98.array_);
    local_88 = '\x03';
  }
  local_78.number_ = local_a8;
  uVar2 = (undefined4)uStack_a0;
  uStack_a0 = uStack_a0 & 0xffffffff00000000;
  local_a8.Natural = 0;
  local_78.array_.index_ = uVar2;
  local_68 = CONCAT71(local_68._1_7_,4);
  Array<Qentem::Value<char>_>::operator+=(&local_98.array_,(Value<char> *)&local_78.array_);
  Value<char>::~Value((Value<char> *)&local_78.array_);
  QVar1 = local_a8;
  if ((void *)local_a8.Natural != (void *)0x0) {
    MemoryRecord::RemoveAllocation((void *)local_a8);
  }
  operator_delete((void *)QVar1);
  String<char>::String((String<char> *)&local_a8,"AA>AA");
  if (local_88 != '\x03') {
    Value<char>::reset((Value<char> *)&local_98.array_);
    local_88 = '\x03';
  }
  local_78.number_ = local_a8;
  uVar2 = (undefined4)uStack_a0;
  uStack_a0 = uStack_a0 & 0xffffffff00000000;
  local_a8.Natural = 0;
  local_78.array_.index_ = uVar2;
  local_68 = CONCAT71(local_68._1_7_,4);
  Array<Qentem::Value<char>_>::operator+=(&local_98.array_,(Value<char> *)&local_78.array_);
  Value<char>::~Value((Value<char> *)&local_78.array_);
  QVar1 = local_a8;
  if ((void *)local_a8.Natural != (void *)0x0) {
    MemoryRecord::RemoveAllocation((void *)local_a8);
  }
  operator_delete((void *)QVar1);
  String<char>::String((String<char> *)&local_a8,"AA&AA");
  if (local_88 != '\x03') {
    Value<char>::reset((Value<char> *)&local_98.array_);
    local_88 = '\x03';
  }
  local_78.number_ = local_a8;
  uVar2 = (undefined4)uStack_a0;
  uStack_a0 = uStack_a0 & 0xffffffff00000000;
  local_a8.Natural = 0;
  local_78.array_.index_ = uVar2;
  local_68 = CONCAT71(local_68._1_7_,4);
  Array<Qentem::Value<char>_>::operator+=(&local_98.array_,(Value<char> *)&local_78.array_);
  Value<char>::~Value((Value<char> *)&local_78.array_);
  QVar1 = local_a8;
  if ((void *)local_a8.Natural != (void *)0x0) {
    MemoryRecord::RemoveAllocation((void *)local_a8);
  }
  operator_delete((void *)QVar1);
  String<char>::String((String<char> *)&local_a8,"AA\"AA");
  if (local_88 != '\x03') {
    Value<char>::reset((Value<char> *)&local_98.array_);
    local_88 = '\x03';
  }
  local_78.number_ = local_a8;
  uVar2 = (undefined4)uStack_a0;
  uStack_a0 = uStack_a0 & 0xffffffff00000000;
  local_a8.Natural = 0;
  local_78.array_.index_ = uVar2;
  local_68 = CONCAT71(local_68._1_7_,4);
  Array<Qentem::Value<char>_>::operator+=(&local_98.array_,(Value<char> *)&local_78.array_);
  Value<char>::~Value((Value<char> *)&local_78.array_);
  QVar1 = local_a8;
  if ((void *)local_a8.Natural != (void *)0x0) {
    MemoryRecord::RemoveAllocation((void *)local_a8);
  }
  operator_delete((void *)QVar1);
  String<char>::String((String<char> *)&local_a8,"AA\'AA");
  if (local_88 != '\x03') {
    Value<char>::reset((Value<char> *)&local_98.array_);
    local_88 = '\x03';
  }
  local_78.number_ = local_a8;
  uVar2 = (undefined4)uStack_a0;
  uStack_a0 = uStack_a0 & 0xffffffff00000000;
  local_a8.Natural = 0;
  local_78.array_.index_ = uVar2;
  local_68 = CONCAT71(local_68._1_7_,4);
  Array<Qentem::Value<char>_>::operator+=(&local_98.array_,(Value<char> *)&local_78.array_);
  Value<char>::~Value((Value<char> *)&local_78.array_);
  QVar1 = local_a8;
  if ((void *)local_a8.Natural != (void *)0x0) {
    MemoryRecord::RemoveAllocation((void *)local_a8);
  }
  operator_delete((void *)QVar1);
  String<char>::String((String<char> *)&local_a8,"AA<<<<AA");
  if (local_88 != '\x03') {
    Value<char>::reset((Value<char> *)&local_98.array_);
    local_88 = '\x03';
  }
  local_78.number_ = local_a8;
  uVar2 = (undefined4)uStack_a0;
  uStack_a0 = uStack_a0 & 0xffffffff00000000;
  local_a8.Natural = 0;
  local_78.array_.index_ = uVar2;
  local_68 = CONCAT71(local_68._1_7_,4);
  Array<Qentem::Value<char>_>::operator+=(&local_98.array_,(Value<char> *)&local_78.array_);
  Value<char>::~Value((Value<char> *)&local_78.array_);
  QVar1 = local_a8;
  if ((void *)local_a8.Natural != (void *)0x0) {
    MemoryRecord::RemoveAllocation((void *)local_a8);
  }
  operator_delete((void *)QVar1);
  String<char>::String((String<char> *)&local_a8,"AA>>>>AA");
  if (local_88 != '\x03') {
    Value<char>::reset((Value<char> *)&local_98.array_);
    local_88 = '\x03';
  }
  local_78.number_ = local_a8;
  uVar2 = (undefined4)uStack_a0;
  uStack_a0 = uStack_a0 & 0xffffffff00000000;
  local_a8.Natural = 0;
  local_78.array_.index_ = uVar2;
  local_68 = CONCAT71(local_68._1_7_,4);
  Array<Qentem::Value<char>_>::operator+=(&local_98.array_,(Value<char> *)&local_78.array_);
  Value<char>::~Value((Value<char> *)&local_78.array_);
  QVar1 = local_a8;
  if ((void *)local_a8.Natural != (void *)0x0) {
    MemoryRecord::RemoveAllocation((void *)local_a8);
  }
  operator_delete((void *)QVar1);
  String<char>::String((String<char> *)&local_a8,"AA&&&&AA");
  if (local_88 != '\x03') {
    Value<char>::reset((Value<char> *)&local_98.array_);
    local_88 = '\x03';
  }
  local_78.number_ = local_a8;
  uVar2 = (undefined4)uStack_a0;
  uStack_a0 = uStack_a0 & 0xffffffff00000000;
  local_a8.Natural = 0;
  local_78.array_.index_ = uVar2;
  local_68 = CONCAT71(local_68._1_7_,4);
  Array<Qentem::Value<char>_>::operator+=(&local_98.array_,(Value<char> *)&local_78.array_);
  Value<char>::~Value((Value<char> *)&local_78.array_);
  QVar1 = local_a8;
  if ((void *)local_a8.Natural != (void *)0x0) {
    MemoryRecord::RemoveAllocation((void *)local_a8);
  }
  operator_delete((void *)QVar1);
  String<char>::String((String<char> *)&local_a8,"AA\"\"\"\"AA");
  if (local_88 != '\x03') {
    Value<char>::reset((Value<char> *)&local_98.array_);
    local_88 = '\x03';
  }
  local_78.number_ = local_a8;
  uVar2 = (undefined4)uStack_a0;
  uStack_a0 = uStack_a0 & 0xffffffff00000000;
  local_a8.Natural = 0;
  local_78.array_.index_ = uVar2;
  local_68 = CONCAT71(local_68._1_7_,4);
  Array<Qentem::Value<char>_>::operator+=(&local_98.array_,(Value<char> *)&local_78.array_);
  Value<char>::~Value((Value<char> *)&local_78.array_);
  QVar1 = local_a8;
  if ((void *)local_a8.Natural != (void *)0x0) {
    MemoryRecord::RemoveAllocation((void *)local_a8);
  }
  operator_delete((void *)QVar1);
  String<char>::String((String<char> *)&local_a8,"AA\'\'\'\'AA");
  if (local_88 != '\x03') {
    Value<char>::reset((Value<char> *)&local_98.array_);
    local_88 = '\x03';
  }
  local_78.number_ = local_a8;
  uVar2 = (undefined4)uStack_a0;
  uStack_a0 = uStack_a0 & 0xffffffff00000000;
  local_a8.Natural = 0;
  local_78.array_.index_ = uVar2;
  local_68 = CONCAT71(local_68._1_7_,4);
  Array<Qentem::Value<char>_>::operator+=(&local_98.array_,(Value<char> *)&local_78.array_);
  Value<char>::~Value((Value<char> *)&local_78.array_);
  QVar1 = local_a8;
  if ((void *)local_a8.Natural != (void *)0x0) {
    MemoryRecord::RemoveAllocation((void *)local_a8);
  }
  operator_delete((void *)QVar1);
  String<char>::String((String<char> *)&local_a8,"<A>B\'C\"D&E\'F\"G<H>I&G\"K");
  if (local_88 != '\x03') {
    Value<char>::reset((Value<char> *)&local_98.array_);
    local_88 = '\x03';
  }
  local_78.number_ = local_a8;
  uVar2 = (undefined4)uStack_a0;
  uStack_a0 = uStack_a0 & 0xffffffff00000000;
  local_a8.Natural = 0;
  local_78.array_.index_ = uVar2;
  local_68 = CONCAT71(local_68._1_7_,4);
  Array<Qentem::Value<char>_>::operator+=(&local_98.array_,(Value<char> *)&local_78.array_);
  Value<char>::~Value((Value<char> *)&local_78.array_);
  QVar1 = local_a8;
  if ((void *)local_a8.Natural != (void *)0x0) {
    MemoryRecord::RemoveAllocation((void *)local_a8);
  }
  operator_delete((void *)QVar1);
  String<char>::String((String<char> *)&local_a8,"AB\"CD\'EF<GH>IGK\'");
  if (local_88 != '\x03') {
    Value<char>::reset((Value<char> *)&local_98.array_);
    local_88 = '\x03';
  }
  local_78.number_ = local_a8;
  uVar2 = (undefined4)uStack_a0;
  uStack_a0 = uStack_a0 & 0xffffffff00000000;
  local_a8.Natural = 0;
  local_78.array_.index_ = uVar2;
  local_68 = CONCAT71(local_68._1_7_,4);
  Array<Qentem::Value<char>_>::operator+=(&local_98.array_,(Value<char> *)&local_78.array_);
  Value<char>::~Value((Value<char> *)&local_78.array_);
  QVar1 = local_a8;
  if ((void *)local_a8.Natural != (void *)0x0) {
    MemoryRecord::RemoveAllocation((void *)local_a8);
  }
  operator_delete((void *)QVar1);
  String<char>::String((String<char> *)&local_a8,"\"ABC\'DEF<GHI>GK<");
  if (local_88 != '\x03') {
    Value<char>::reset((Value<char> *)&local_98.array_);
    local_88 = '\x03';
  }
  local_78.number_ = local_a8;
  uVar2 = (undefined4)uStack_a0;
  uStack_a0 = uStack_a0 & 0xffffffff00000000;
  local_a8.Natural = 0;
  local_78.array_.index_ = uVar2;
  local_68 = CONCAT71(local_68._1_7_,4);
  Array<Qentem::Value<char>_>::operator+=(&local_98.array_,(Value<char> *)&local_78.array_);
  Value<char>::~Value((Value<char> *)&local_78.array_);
  QVar1 = local_a8;
  if ((void *)local_a8.Natural != (void *)0x0) {
    MemoryRecord::RemoveAllocation((void *)local_a8);
  }
  operator_delete((void *)QVar1);
  String<char>::String((String<char> *)&local_a8,"A\"\"BC<<DE>>FG\'\'HI&&GK");
  if (local_88 != '\x03') {
    Value<char>::reset((Value<char> *)&local_98.array_);
    local_88 = '\x03';
  }
  local_78.number_ = local_a8;
  uVar2 = (undefined4)uStack_a0;
  uStack_a0 = uStack_a0 & 0xffffffff00000000;
  local_a8.Natural = 0;
  local_78.array_.index_ = uVar2;
  local_68 = CONCAT71(local_68._1_7_,4);
  Array<Qentem::Value<char>_>::operator+=(&local_98.array_,(Value<char> *)&local_78.array_);
  Value<char>::~Value((Value<char> *)&local_78.array_);
  QVar1 = local_a8;
  if ((void *)local_a8.Natural != (void *)0x0) {
    MemoryRecord::RemoveAllocation((void *)local_a8);
  }
  operator_delete((void *)QVar1);
  local_a8.Natural = 0;
  uStack_a0 = 0;
  local_68 = 0;
  local_78.array_.storage_ = (Value<char> *)0x0;
  local_78._8_8_ = 0;
  local_60 = "{var:0}";
  local_58 = 7;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::parse
            ("{var:0}",7,(Array<Qentem::Tags::TagBit> *)&local_a8);
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::Render
            ((TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_> *)
             &local_78.array_,(Array<Qentem::Tags::TagBit> *)&local_a8,
             (Value<char> *)&local_98.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_a8);
  this = local_50;
  QTest::IsEqual<Qentem::StringStream<char>,char[5]>
            (local_50,&local_48,(char (*) [5])0x130f9b,0x289);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_68 = 0;
  local_78.array_.storage_ = (Value<char> *)0x0;
  local_78._8_8_ = 0;
  local_60 = "{var:1}";
  local_58 = 7;
  local_a8.Natural = 0;
  uStack_a0 = 0;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::parse
            ("{var:1}",7,(Array<Qentem::Tags::TagBit> *)&local_a8);
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::Render
            ((TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_> *)
             &local_78.array_,(Array<Qentem::Tags::TagBit> *)&local_a8,
             (Value<char> *)&local_98.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_a8);
  QTest::IsEqual<Qentem::StringStream<char>,char[5]>(this,&local_48,(char (*) [5])0x130ea9,0x28c);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_68 = 0;
  local_a8.Natural = 0;
  uStack_a0 = 0;
  local_78.array_.storage_ = (Value<char> *)0x0;
  local_78._8_8_ = 0;
  local_60 = "{var:2}";
  local_58 = 7;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::parse
            ("{var:2}",7,(Array<Qentem::Tags::TagBit> *)&local_a8);
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::Render
            ((TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_> *)
             &local_78.array_,(Array<Qentem::Tags::TagBit> *)&local_a8,
             (Value<char> *)&local_98.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_a8);
  QTest::IsEqual<Qentem::StringStream<char>,char[6]>(this,&local_48,(char (*) [6])0x130fdb,0x28f);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_68 = 0;
  local_a8.Natural = 0;
  uStack_a0 = 0;
  local_78.array_.storage_ = (Value<char> *)0x0;
  local_78._8_8_ = 0;
  local_60 = "{var:3}";
  local_58 = 7;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::parse
            ("{var:3}",7,(Array<Qentem::Tags::TagBit> *)&local_a8);
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::Render
            ((TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_> *)
             &local_78.array_,(Array<Qentem::Tags::TagBit> *)&local_a8,
             (Value<char> *)&local_98.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_a8);
  QTest::IsEqual<Qentem::StringStream<char>,char[7]>(this,&local_48,(char (*) [7])0x130f35,0x292);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_68 = 0;
  local_a8.Natural = 0;
  uStack_a0 = 0;
  local_78.array_.storage_ = (Value<char> *)0x0;
  local_78._8_8_ = 0;
  local_60 = "{var:4}";
  local_58 = 7;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::parse
            ("{var:4}",7,(Array<Qentem::Tags::TagBit> *)&local_a8);
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::Render
            ((TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_> *)
             &local_78.array_,(Array<Qentem::Tags::TagBit> *)&local_a8,
             (Value<char> *)&local_98.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_a8);
  QTest::IsEqual<Qentem::StringStream<char>,char[7]>(this,&local_48,(char (*) [7])0x131397,0x295);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_68 = 0;
  local_a8.Natural = 0;
  uStack_a0 = 0;
  local_78.array_.storage_ = (Value<char> *)0x0;
  local_78._8_8_ = 0;
  local_60 = "{var:5}";
  local_58 = 7;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::parse
            ("{var:5}",7,(Array<Qentem::Tags::TagBit> *)&local_a8);
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::Render
            ((TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_> *)
             &local_78.array_,(Array<Qentem::Tags::TagBit> *)&local_a8,
             (Value<char> *)&local_98.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_a8);
  QTest::IsEqual<Qentem::StringStream<char>,char[9]>(this,&local_48,(char (*) [9])"&lt;&gt;",0x298);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_68 = 0;
  local_78.array_.storage_ = (Value<char> *)0x0;
  local_78._8_8_ = 0;
  local_60 = "{var:6}";
  local_58 = 7;
  local_a8.Natural = 0;
  uStack_a0 = 0;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::parse
            ("{var:6}",7,(Array<Qentem::Tags::TagBit> *)&local_a8);
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::Render
            ((TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_> *)
             &local_78.array_,(Array<Qentem::Tags::TagBit> *)&local_a8,
             (Value<char> *)&local_98.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_a8);
  QTest::IsEqual<Qentem::StringStream<char>,char[10]>
            (this,&local_48,(char (*) [10])"&lt;&amp;",0x29b);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_68 = 0;
  local_a8.Natural = 0;
  uStack_a0 = 0;
  local_78.array_.storage_ = (Value<char> *)0x0;
  local_78._8_8_ = 0;
  local_60 = "{var:7}";
  local_58 = 7;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::parse
            ("{var:7}",7,(Array<Qentem::Tags::TagBit> *)&local_a8);
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::Render
            ((TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_> *)
             &local_78.array_,(Array<Qentem::Tags::TagBit> *)&local_a8,
             (Value<char> *)&local_98.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_a8);
  QTest::IsEqual<Qentem::StringStream<char>,char[10]>
            (this,&local_48,(char (*) [10])"&lt;&amp;",0x29e);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_68 = 0;
  local_78.array_.storage_ = (Value<char> *)0x0;
  local_78._8_8_ = 0;
  local_60 = "{var:8}";
  local_a8.Natural = 0;
  uStack_a0 = 0;
  local_58 = 7;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::parse
            ("{var:8}",7,(Array<Qentem::Tags::TagBit> *)&local_a8);
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::Render
            ((TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_> *)
             &local_78.array_,(Array<Qentem::Tags::TagBit> *)&local_a8,
             (Value<char> *)&local_98.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_a8);
  QTest::IsEqual<Qentem::StringStream<char>,char[11]>
            (this,&local_48,(char (*) [11])"&gt;&quot;",0x2a1);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_68 = 0;
  local_a8.Natural = 0;
  uStack_a0 = 0;
  local_78.array_.storage_ = (Value<char> *)0x0;
  local_78._8_8_ = 0;
  local_60 = "{var:9}";
  local_58 = 7;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::parse
            ("{var:9}",7,(Array<Qentem::Tags::TagBit> *)&local_a8);
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::Render
            ((TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_> *)
             &local_78.array_,(Array<Qentem::Tags::TagBit> *)&local_a8,
             (Value<char> *)&local_98.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_a8);
  QTest::IsEqual<Qentem::StringStream<char>,char[13]>
            (this,&local_48,(char (*) [13])"&quot;&apos;",0x2a4);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_68 = 0;
  local_a8.Natural = 0;
  uStack_a0 = 0;
  local_78.array_.storage_ = (Value<char> *)0x0;
  local_78._8_8_ = 0;
  local_60 = "{var:10}";
  local_58 = 8;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::parse
            ("{var:10}",8,(Array<Qentem::Tags::TagBit> *)&local_a8);
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::Render
            ((TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_> *)
             &local_78.array_,(Array<Qentem::Tags::TagBit> *)&local_a8,
             (Value<char> *)&local_98.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_a8);
  QTest::IsEqual<Qentem::StringStream<char>,char[15]>
            (this,&local_48,(char (*) [15])"&lt;&quot;&gt;",0x2a7);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_68 = 0;
  local_a8.Natural = 0;
  uStack_a0 = 0;
  local_78.array_.storage_ = (Value<char> *)0x0;
  local_78._8_8_ = 0;
  local_60 = "{var:11}";
  local_58 = 8;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::parse
            ("{var:11}",8,(Array<Qentem::Tags::TagBit> *)&local_a8);
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::Render
            ((TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_> *)
             &local_78.array_,(Array<Qentem::Tags::TagBit> *)&local_a8,
             (Value<char> *)&local_98.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_a8);
  QTest::IsEqual<Qentem::StringStream<char>,char[15]>
            (this,&local_48,(char (*) [15])"&lt;&apos;&gt;",0x2aa);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_68 = 0;
  local_a8.Natural = 0;
  uStack_a0 = 0;
  local_78.array_.storage_ = (Value<char> *)0x0;
  local_78._8_8_ = 0;
  local_60 = "{var:12}";
  local_58 = 8;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::parse
            ("{var:12}",8,(Array<Qentem::Tags::TagBit> *)&local_a8);
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::Render
            ((TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_> *)
             &local_78.array_,(Array<Qentem::Tags::TagBit> *)&local_a8,
             (Value<char> *)&local_98.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_a8);
  QTest::IsEqual<Qentem::StringStream<char>,char[14]>
            (this,&local_48,(char (*) [14])"&lt;&amp;&gt;",0x2ad);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_68 = 0;
  local_a8.Natural = 0;
  uStack_a0 = 0;
  local_78.array_.storage_ = (Value<char> *)0x0;
  local_78._8_8_ = 0;
  local_60 = "{var:13}";
  local_58 = 8;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::parse
            ("{var:13}",8,(Array<Qentem::Tags::TagBit> *)&local_a8);
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::Render
            ((TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_> *)
             &local_78.array_,(Array<Qentem::Tags::TagBit> *)&local_a8,
             (Value<char> *)&local_98.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_a8);
  QTest::IsEqual<Qentem::StringStream<char>,char[17]>
            (this,&local_48,(char (*) [17])"&amp;&quot;&amp;",0x2b0);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_68 = 0;
  local_a8.Natural = 0;
  uStack_a0 = 0;
  local_78.array_.storage_ = (Value<char> *)0x0;
  local_78._8_8_ = 0;
  local_60 = "{var:14}";
  local_58 = 8;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::parse
            ("{var:14}",8,(Array<Qentem::Tags::TagBit> *)&local_a8);
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::Render
            ((TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_> *)
             &local_78.array_,(Array<Qentem::Tags::TagBit> *)&local_a8,
             (Value<char> *)&local_98.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_a8);
  QTest::IsEqual<Qentem::StringStream<char>,char[19]>
            (this,&local_48,(char (*) [19])"&quot;&apos;&quot;",0x2b3);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_68 = 0;
  local_a8.Natural = 0;
  uStack_a0 = 0;
  local_78.array_.storage_ = (Value<char> *)0x0;
  local_78._8_8_ = 0;
  local_60 = "{var:15}";
  local_58 = 8;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::parse
            ("{var:15}",8,(Array<Qentem::Tags::TagBit> *)&local_a8);
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::Render
            ((TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_> *)
             &local_78.array_,(Array<Qentem::Tags::TagBit> *)&local_a8,
             (Value<char> *)&local_98.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_a8);
  QTest::IsEqual<Qentem::StringStream<char>,char[17]>
            (this,&local_48,(char (*) [17])"&apos;&lt;&apos;",0x2b6);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_68 = 0;
  local_a8.Natural = 0;
  uStack_a0 = 0;
  local_78.array_.storage_ = (Value<char> *)0x0;
  local_78._8_8_ = 0;
  local_60 = "{var:16}";
  local_58 = 8;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::parse
            ("{var:16}",8,(Array<Qentem::Tags::TagBit> *)&local_a8);
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::Render
            ((TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_> *)
             &local_78.array_,(Array<Qentem::Tags::TagBit> *)&local_a8,
             (Value<char> *)&local_98.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_a8);
  QTest::IsEqual<Qentem::StringStream<char>,char[18]>
            (this,&local_48,(char (*) [18])"&apos;&amp;&apos;",0x2b9);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_68 = 0;
  local_a8.Natural = 0;
  uStack_a0 = 0;
  local_78.array_.storage_ = (Value<char> *)0x0;
  local_78._8_8_ = 0;
  local_60 = "{var:17}";
  local_58 = 8;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::parse
            ("{var:17}",8,(Array<Qentem::Tags::TagBit> *)&local_a8);
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::Render
            ((TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_> *)
             &local_78.array_,(Array<Qentem::Tags::TagBit> *)&local_a8,
             (Value<char> *)&local_98.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_a8);
  QTest::IsEqual<Qentem::StringStream<char>,char[26]>
            (this,&local_48,(char (*) [26])"&lt;&gt;&amp;&apos;&quot;",700);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_68 = 0;
  local_a8.Natural = 0;
  uStack_a0 = 0;
  local_78.array_.storage_ = (Value<char> *)0x0;
  local_78._8_8_ = 0;
  local_60 = "{var:18}";
  local_58 = 8;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::parse
            ("{var:18}",8,(Array<Qentem::Tags::TagBit> *)&local_a8);
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::Render
            ((TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_> *)
             &local_78.array_,(Array<Qentem::Tags::TagBit> *)&local_a8,
             (Value<char> *)&local_98.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_a8);
  QTest::IsEqual<Qentem::StringStream<char>,char[26]>
            (this,&local_48,(char (*) [26])"&apos;&quot;&lt;&gt;&amp;",0x2bf);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_68 = 0;
  local_a8.Natural = 0;
  uStack_a0 = 0;
  local_78.array_.storage_ = (Value<char> *)0x0;
  local_78._8_8_ = 0;
  local_60 = "{var:19}";
  local_58 = 8;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::parse
            ("{var:19}",8,(Array<Qentem::Tags::TagBit> *)&local_a8);
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::Render
            ((TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_> *)
             &local_78.array_,(Array<Qentem::Tags::TagBit> *)&local_a8,
             (Value<char> *)&local_98.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_a8);
  QTest::IsEqual<Qentem::StringStream<char>,char[26]>
            (this,&local_48,(char (*) [26])"&lt;&quot;&amp;&apos;&gt;",0x2c2);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_68 = 0;
  local_a8.Natural = 0;
  uStack_a0 = 0;
  local_78.array_.storage_ = (Value<char> *)0x0;
  local_78._8_8_ = 0;
  local_60 = "{var:20}";
  local_58 = 8;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::parse
            ("{var:20}",8,(Array<Qentem::Tags::TagBit> *)&local_a8);
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::Render
            ((TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_> *)
             &local_78.array_,(Array<Qentem::Tags::TagBit> *)&local_a8,
             (Value<char> *)&local_98.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_a8);
  QTest::IsEqual<Qentem::StringStream<char>,char[21]>
            (this,&local_48,(char (*) [21])"&lt;&lt;&lt;&lt;&lt;",0x2c5);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_68 = 0;
  local_a8.Natural = 0;
  uStack_a0 = 0;
  local_78.array_.storage_ = (Value<char> *)0x0;
  local_78._8_8_ = 0;
  local_60 = "{var:21}";
  local_58 = 8;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::parse
            ("{var:21}",8,(Array<Qentem::Tags::TagBit> *)&local_a8);
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::Render
            ((TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_> *)
             &local_78.array_,(Array<Qentem::Tags::TagBit> *)&local_a8,
             (Value<char> *)&local_98.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_a8);
  QTest::IsEqual<Qentem::StringStream<char>,char[21]>
            (this,&local_48,(char (*) [21])"&gt;&gt;&gt;&gt;&gt;",0x2c8);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_68 = 0;
  local_a8.Natural = 0;
  uStack_a0 = 0;
  local_78.array_.storage_ = (Value<char> *)0x0;
  local_78._8_8_ = 0;
  local_60 = "{var:22}";
  local_58 = 8;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::parse
            ("{var:22}",8,(Array<Qentem::Tags::TagBit> *)&local_a8);
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::Render
            ((TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_> *)
             &local_78.array_,(Array<Qentem::Tags::TagBit> *)&local_a8,
             (Value<char> *)&local_98.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_a8);
  QTest::IsEqual<Qentem::StringStream<char>,char[26]>
            (this,&local_48,(char (*) [26])"&amp;&amp;&amp;&amp;&amp;",0x2cb);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_68 = 0;
  local_a8.Natural = 0;
  uStack_a0 = 0;
  local_78.array_.storage_ = (Value<char> *)0x0;
  local_78._8_8_ = 0;
  local_60 = "{var:23}";
  local_58 = 8;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::parse
            ("{var:23}",8,(Array<Qentem::Tags::TagBit> *)&local_a8);
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::Render
            ((TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_> *)
             &local_78.array_,(Array<Qentem::Tags::TagBit> *)&local_a8,
             (Value<char> *)&local_98.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_a8);
  QTest::IsEqual<Qentem::StringStream<char>,char[31]>
            (this,&local_48,(char (*) [31])"&quot;&quot;&quot;&quot;&quot;",0x2ce);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_68 = 0;
  local_a8.Natural = 0;
  uStack_a0 = 0;
  local_78.array_.storage_ = (Value<char> *)0x0;
  local_78._8_8_ = 0;
  local_60 = "{var:24}";
  local_58 = 8;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::parse
            ("{var:24}",8,(Array<Qentem::Tags::TagBit> *)&local_a8);
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::Render
            ((TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_> *)
             &local_78.array_,(Array<Qentem::Tags::TagBit> *)&local_a8,
             (Value<char> *)&local_98.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_a8);
  QTest::IsEqual<Qentem::StringStream<char>,char[31]>
            (this,&local_48,(char (*) [31])"&apos;&apos;&apos;&apos;&apos;",0x2d1);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_68 = 0;
  local_a8.Natural = 0;
  uStack_a0 = 0;
  local_78.array_.storage_ = (Value<char> *)0x0;
  local_78._8_8_ = 0;
  local_60 = "{var:25}";
  local_58 = 8;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::parse
            ("{var:25}",8,(Array<Qentem::Tags::TagBit> *)&local_a8);
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::Render
            ((TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_> *)
             &local_78.array_,(Array<Qentem::Tags::TagBit> *)&local_a8,
             (Value<char> *)&local_98.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_a8);
  QTest::IsEqual<Qentem::StringStream<char>,char[6]>(this,&local_48,(char (*) [6])"A&lt;",0x2d4);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_68 = 0;
  local_a8.Natural = 0;
  uStack_a0 = 0;
  local_78.array_.storage_ = (Value<char> *)0x0;
  local_78._8_8_ = 0;
  local_60 = "{var:26}";
  local_58 = 8;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::parse
            ("{var:26}",8,(Array<Qentem::Tags::TagBit> *)&local_a8);
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::Render
            ((TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_> *)
             &local_78.array_,(Array<Qentem::Tags::TagBit> *)&local_a8,
             (Value<char> *)&local_98.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_a8);
  QTest::IsEqual<Qentem::StringStream<char>,char[6]>(this,&local_48,(char (*) [6])"A&gt;",0x2d7);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_68 = 0;
  local_a8.Natural = 0;
  uStack_a0 = 0;
  local_78.array_.storage_ = (Value<char> *)0x0;
  local_78._8_8_ = 0;
  local_60 = "{var:27}";
  local_58 = 8;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::parse
            ("{var:27}",8,(Array<Qentem::Tags::TagBit> *)&local_a8);
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::Render
            ((TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_> *)
             &local_78.array_,(Array<Qentem::Tags::TagBit> *)&local_a8,
             (Value<char> *)&local_98.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_a8);
  QTest::IsEqual<Qentem::StringStream<char>,char[7]>(this,&local_48,(char (*) [7])"A&amp;",0x2da);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_68 = 0;
  local_a8.Natural = 0;
  uStack_a0 = 0;
  local_78.array_.storage_ = (Value<char> *)0x0;
  local_78._8_8_ = 0;
  local_60 = "{var:28}";
  local_58 = 8;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::parse
            ("{var:28}",8,(Array<Qentem::Tags::TagBit> *)&local_a8);
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::Render
            ((TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_> *)
             &local_78.array_,(Array<Qentem::Tags::TagBit> *)&local_a8,
             (Value<char> *)&local_98.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_a8);
  QTest::IsEqual<Qentem::StringStream<char>,char[8]>(this,&local_48,(char (*) [8])"A&quot;",0x2dd);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_68 = 0;
  local_a8.Natural = 0;
  uStack_a0 = 0;
  local_78.array_.storage_ = (Value<char> *)0x0;
  local_78._8_8_ = 0;
  local_60 = "{var:29}";
  local_58 = 8;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::parse
            ("{var:29}",8,(Array<Qentem::Tags::TagBit> *)&local_a8);
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::Render
            ((TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_> *)
             &local_78.array_,(Array<Qentem::Tags::TagBit> *)&local_a8,
             (Value<char> *)&local_98.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_a8);
  QTest::IsEqual<Qentem::StringStream<char>,char[8]>(this,&local_48,(char (*) [8])"A&apos;",0x2e0);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_68 = 0;
  local_a8.Natural = 0;
  uStack_a0 = 0;
  local_78.array_.storage_ = (Value<char> *)0x0;
  local_78._8_8_ = 0;
  local_60 = "{var:30}";
  local_58 = 8;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::parse
            ("{var:30}",8,(Array<Qentem::Tags::TagBit> *)&local_a8);
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::Render
            ((TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_> *)
             &local_78.array_,(Array<Qentem::Tags::TagBit> *)&local_a8,
             (Value<char> *)&local_98.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_a8);
  QTest::IsEqual<Qentem::StringStream<char>,char[6]>(this,&local_48,(char (*) [6])0x1310b8,0x2e3);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_68 = 0;
  local_a8.Natural = 0;
  uStack_a0 = 0;
  local_78.array_.storage_ = (Value<char> *)0x0;
  local_78._8_8_ = 0;
  local_60 = "{var:31}";
  local_58 = 8;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::parse
            ("{var:31}",8,(Array<Qentem::Tags::TagBit> *)&local_a8);
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::Render
            ((TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_> *)
             &local_78.array_,(Array<Qentem::Tags::TagBit> *)&local_a8,
             (Value<char> *)&local_98.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_a8);
  QTest::IsEqual<Qentem::StringStream<char>,char[6]>(this,&local_48,(char (*) [6])0x1310c8,0x2e6);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_68 = 0;
  local_a8.Natural = 0;
  uStack_a0 = 0;
  local_78.array_.storage_ = (Value<char> *)0x0;
  local_78._8_8_ = 0;
  local_60 = "{var:32}";
  local_58 = 8;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::parse
            ("{var:32}",8,(Array<Qentem::Tags::TagBit> *)&local_a8);
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::Render
            ((TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_> *)
             &local_78.array_,(Array<Qentem::Tags::TagBit> *)&local_a8,
             (Value<char> *)&local_98.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_a8);
  QTest::IsEqual<Qentem::StringStream<char>,char[7]>(this,&local_48,(char (*) [7])0x1310d8,0x2e9);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_68 = 0;
  local_a8.Natural = 0;
  uStack_a0 = 0;
  local_78.array_.storage_ = (Value<char> *)0x0;
  local_78._8_8_ = 0;
  local_60 = "{var:33}";
  local_58 = 8;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::parse
            ("{var:33}",8,(Array<Qentem::Tags::TagBit> *)&local_a8);
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::Render
            ((TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_> *)
             &local_78.array_,(Array<Qentem::Tags::TagBit> *)&local_a8,
             (Value<char> *)&local_98.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_a8);
  QTest::IsEqual<Qentem::StringStream<char>,char[8]>(this,&local_48,(char (*) [8])0x1310e9,0x2ec);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_68 = 0;
  local_a8.Natural = 0;
  uStack_a0 = 0;
  local_78.array_.storage_ = (Value<char> *)0x0;
  local_78._8_8_ = 0;
  local_60 = "{var:34}";
  local_58 = 8;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::parse
            ("{var:34}",8,(Array<Qentem::Tags::TagBit> *)&local_a8);
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::Render
            ((TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_> *)
             &local_78.array_,(Array<Qentem::Tags::TagBit> *)&local_a8,
             (Value<char> *)&local_98.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_a8);
  QTest::IsEqual<Qentem::StringStream<char>,char[8]>(this,&local_48,(char (*) [8])0x1310fb,0x2ef);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_68 = 0;
  local_a8.Natural = 0;
  uStack_a0 = 0;
  local_78.array_.storage_ = (Value<char> *)0x0;
  local_78._8_8_ = 0;
  local_60 = "{var:35}";
  local_58 = 8;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::parse
            ("{var:35}",8,(Array<Qentem::Tags::TagBit> *)&local_a8);
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::Render
            ((TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_> *)
             &local_78.array_,(Array<Qentem::Tags::TagBit> *)&local_a8,
             (Value<char> *)&local_98.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_a8);
  QTest::IsEqual<Qentem::StringStream<char>,char[7]>(this,&local_48,(char (*) [7])"A&lt;A",0x2f2);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_68 = 0;
  local_a8.Natural = 0;
  uStack_a0 = 0;
  local_78.array_.storage_ = (Value<char> *)0x0;
  local_78._8_8_ = 0;
  local_60 = "{var:36}";
  local_58 = 8;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::parse
            ("{var:36}",8,(Array<Qentem::Tags::TagBit> *)&local_a8);
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::Render
            ((TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_> *)
             &local_78.array_,(Array<Qentem::Tags::TagBit> *)&local_a8,
             (Value<char> *)&local_98.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_a8);
  QTest::IsEqual<Qentem::StringStream<char>,char[7]>(this,&local_48,(char (*) [7])"A&gt;A",0x2f5);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_68 = 0;
  local_a8.Natural = 0;
  uStack_a0 = 0;
  local_78.array_.storage_ = (Value<char> *)0x0;
  local_78._8_8_ = 0;
  local_60 = "{var:37}";
  local_58 = 8;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::parse
            ("{var:37}",8,(Array<Qentem::Tags::TagBit> *)&local_a8);
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::Render
            ((TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_> *)
             &local_78.array_,(Array<Qentem::Tags::TagBit> *)&local_a8,
             (Value<char> *)&local_98.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_a8);
  QTest::IsEqual<Qentem::StringStream<char>,char[8]>(this,&local_48,(char (*) [8])"A&amp;A",0x2f8);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_68 = 0;
  local_a8.Natural = 0;
  uStack_a0 = 0;
  local_78.array_.storage_ = (Value<char> *)0x0;
  local_78._8_8_ = 0;
  local_60 = "{var:38}";
  local_58 = 8;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::parse
            ("{var:38}",8,(Array<Qentem::Tags::TagBit> *)&local_a8);
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::Render
            ((TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_> *)
             &local_78.array_,(Array<Qentem::Tags::TagBit> *)&local_a8,
             (Value<char> *)&local_98.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_a8);
  QTest::IsEqual<Qentem::StringStream<char>,char[9]>(this,&local_48,(char (*) [9])"A&quot;A",0x2fb);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_68 = 0;
  local_a8.Natural = 0;
  uStack_a0 = 0;
  local_78.array_.storage_ = (Value<char> *)0x0;
  local_78._8_8_ = 0;
  local_60 = "{var:39}";
  local_58 = 8;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::parse
            ("{var:39}",8,(Array<Qentem::Tags::TagBit> *)&local_a8);
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::Render
            ((TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_> *)
             &local_78.array_,(Array<Qentem::Tags::TagBit> *)&local_a8,
             (Value<char> *)&local_98.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_a8);
  QTest::IsEqual<Qentem::StringStream<char>,char[9]>(this,&local_48,(char (*) [9])"A&apos;A",0x2fe);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_68 = 0;
  local_a8.Natural = 0;
  uStack_a0 = 0;
  local_78.array_.storage_ = (Value<char> *)0x0;
  local_78._8_8_ = 0;
  local_60 = "{var:40}";
  local_58 = 8;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::parse
            ("{var:40}",8,(Array<Qentem::Tags::TagBit> *)&local_a8);
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::Render
            ((TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_> *)
             &local_78.array_,(Array<Qentem::Tags::TagBit> *)&local_a8,
             (Value<char> *)&local_98.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_a8);
  QTest::IsEqual<Qentem::StringStream<char>,char[9]>(this,&local_48,(char (*) [9])"AA&lt;AA",0x301);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_68 = 0;
  local_a8.Natural = 0;
  uStack_a0 = 0;
  local_78.array_.storage_ = (Value<char> *)0x0;
  local_78._8_8_ = 0;
  local_60 = "{var:41}";
  local_58 = 8;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::parse
            ("{var:41}",8,(Array<Qentem::Tags::TagBit> *)&local_a8);
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::Render
            ((TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_> *)
             &local_78.array_,(Array<Qentem::Tags::TagBit> *)&local_a8,
             (Value<char> *)&local_98.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_a8);
  QTest::IsEqual<Qentem::StringStream<char>,char[9]>(this,&local_48,(char (*) [9])"AA&gt;AA",0x304);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_68 = 0;
  local_a8.Natural = 0;
  uStack_a0 = 0;
  local_78.array_.storage_ = (Value<char> *)0x0;
  local_78._8_8_ = 0;
  local_60 = "{var:42}";
  local_58 = 8;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::parse
            ("{var:42}",8,(Array<Qentem::Tags::TagBit> *)&local_a8);
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::Render
            ((TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_> *)
             &local_78.array_,(Array<Qentem::Tags::TagBit> *)&local_a8,
             (Value<char> *)&local_98.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_a8);
  QTest::IsEqual<Qentem::StringStream<char>,char[10]>
            (this,&local_48,(char (*) [10])"AA&amp;AA",0x307);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_68 = 0;
  local_a8.Natural = 0;
  uStack_a0 = 0;
  local_78.array_.storage_ = (Value<char> *)0x0;
  local_78._8_8_ = 0;
  local_60 = "{var:43}";
  local_58 = 8;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::parse
            ("{var:43}",8,(Array<Qentem::Tags::TagBit> *)&local_a8);
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::Render
            ((TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_> *)
             &local_78.array_,(Array<Qentem::Tags::TagBit> *)&local_a8,
             (Value<char> *)&local_98.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_a8);
  QTest::IsEqual<Qentem::StringStream<char>,char[11]>
            (this,&local_48,(char (*) [11])"AA&quot;AA",0x30a);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_68 = 0;
  local_a8.Natural = 0;
  uStack_a0 = 0;
  local_78.array_.storage_ = (Value<char> *)0x0;
  local_78._8_8_ = 0;
  local_60 = "{var:44}";
  local_58 = 8;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::parse
            ("{var:44}",8,(Array<Qentem::Tags::TagBit> *)&local_a8);
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::Render
            ((TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_> *)
             &local_78.array_,(Array<Qentem::Tags::TagBit> *)&local_a8,
             (Value<char> *)&local_98.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_a8);
  QTest::IsEqual<Qentem::StringStream<char>,char[11]>
            (this,&local_48,(char (*) [11])"AA&apos;AA",0x30d);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_68 = 0;
  local_a8.Natural = 0;
  uStack_a0 = 0;
  local_78.array_.storage_ = (Value<char> *)0x0;
  local_78._8_8_ = 0;
  local_60 = "{var:45}";
  local_58 = 8;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::parse
            ("{var:45}",8,(Array<Qentem::Tags::TagBit> *)&local_a8);
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::Render
            ((TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_> *)
             &local_78.array_,(Array<Qentem::Tags::TagBit> *)&local_a8,
             (Value<char> *)&local_98.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_a8);
  QTest::IsEqual<Qentem::StringStream<char>,char[21]>
            (this,&local_48,(char (*) [21])"AA&lt;&lt;&lt;&lt;AA",0x310);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_68 = 0;
  local_a8.Natural = 0;
  uStack_a0 = 0;
  local_78.array_.storage_ = (Value<char> *)0x0;
  local_78._8_8_ = 0;
  local_60 = "{var:46}";
  local_58 = 8;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::parse
            ("{var:46}",8,(Array<Qentem::Tags::TagBit> *)&local_a8);
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::Render
            ((TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_> *)
             &local_78.array_,(Array<Qentem::Tags::TagBit> *)&local_a8,
             (Value<char> *)&local_98.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_a8);
  QTest::IsEqual<Qentem::StringStream<char>,char[21]>
            (this,&local_48,(char (*) [21])"AA&gt;&gt;&gt;&gt;AA",0x313);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_68 = 0;
  local_a8.Natural = 0;
  uStack_a0 = 0;
  local_78.array_.storage_ = (Value<char> *)0x0;
  local_78._8_8_ = 0;
  local_60 = "{var:47}";
  local_58 = 8;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::parse
            ("{var:47}",8,(Array<Qentem::Tags::TagBit> *)&local_a8);
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::Render
            ((TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_> *)
             &local_78.array_,(Array<Qentem::Tags::TagBit> *)&local_a8,
             (Value<char> *)&local_98.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_a8);
  QTest::IsEqual<Qentem::StringStream<char>,char[25]>
            (this,&local_48,(char (*) [25])"AA&amp;&amp;&amp;&amp;AA",0x316);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_68 = 0;
  local_a8.Natural = 0;
  uStack_a0 = 0;
  local_78.array_.storage_ = (Value<char> *)0x0;
  local_78._8_8_ = 0;
  local_60 = "{var:48}";
  local_58 = 8;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::parse
            ("{var:48}",8,(Array<Qentem::Tags::TagBit> *)&local_a8);
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::Render
            ((TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_> *)
             &local_78.array_,(Array<Qentem::Tags::TagBit> *)&local_a8,
             (Value<char> *)&local_98.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_a8);
  QTest::IsEqual<Qentem::StringStream<char>,char[29]>
            (this,&local_48,(char (*) [29])"AA&quot;&quot;&quot;&quot;AA",0x319);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_68 = 0;
  local_a8.Natural = 0;
  uStack_a0 = 0;
  local_78.array_.storage_ = (Value<char> *)0x0;
  local_78._8_8_ = 0;
  local_60 = "{var:49}";
  local_58 = 8;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::parse
            ("{var:49}",8,(Array<Qentem::Tags::TagBit> *)&local_a8);
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::Render
            ((TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_> *)
             &local_78.array_,(Array<Qentem::Tags::TagBit> *)&local_a8,
             (Value<char> *)&local_98.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_a8);
  QTest::IsEqual<Qentem::StringStream<char>,char[29]>
            (this,&local_48,(char (*) [29])"AA&apos;&apos;&apos;&apos;AA",0x31c);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_68 = 0;
  local_a8.Natural = 0;
  uStack_a0 = 0;
  local_78.array_.storage_ = (Value<char> *)0x0;
  local_78._8_8_ = 0;
  local_60 = "{var:50}";
  local_58 = 8;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::parse
            ("{var:50}",8,(Array<Qentem::Tags::TagBit> *)&local_a8);
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::Render
            ((TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_> *)
             &local_78.array_,(Array<Qentem::Tags::TagBit> *)&local_a8,
             (Value<char> *)&local_98.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_a8);
  QTest::IsEqual<Qentem::StringStream<char>,char[68]>
            (this,&local_48,
             (char (*) [68])"&lt;A&gt;B&apos;C&quot;D&amp;E&apos;F&quot;G&lt;H&gt;I&amp;G&quot;K",
             800);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_68 = 0;
  local_a8.Natural = 0;
  uStack_a0 = 0;
  local_78.array_.storage_ = (Value<char> *)0x0;
  local_78._8_8_ = 0;
  local_60 = "{var:51}";
  local_58 = 8;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::parse
            ("{var:51}",8,(Array<Qentem::Tags::TagBit> *)&local_a8);
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::Render
            ((TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_> *)
             &local_78.array_,(Array<Qentem::Tags::TagBit> *)&local_a8,
             (Value<char> *)&local_98.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_a8);
  QTest::IsEqual<Qentem::StringStream<char>,char[38]>
            (this,&local_48,(char (*) [38])"AB&quot;CD&apos;EF&lt;GH&gt;IGK&apos;",0x323);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_68 = 0;
  local_a8.Natural = 0;
  uStack_a0 = 0;
  local_78.array_.storage_ = (Value<char> *)0x0;
  local_78._8_8_ = 0;
  local_60 = "{var:52}";
  local_58 = 8;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::parse
            ("{var:52}",8,(Array<Qentem::Tags::TagBit> *)&local_a8);
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::Render
            ((TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_> *)
             &local_78.array_,(Array<Qentem::Tags::TagBit> *)&local_a8,
             (Value<char> *)&local_98.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_a8);
  QTest::IsEqual<Qentem::StringStream<char>,char[36]>
            (this,&local_48,(char (*) [36])"&quot;ABC&apos;DEF&lt;GHI&gt;GK&lt;",0x326);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_68 = 0;
  local_a8.Natural = 0;
  uStack_a0 = 0;
  local_78.array_.storage_ = (Value<char> *)0x0;
  local_78._8_8_ = 0;
  local_60 = "{var:53}";
  local_58 = 8;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::parse
            ("{var:53}",8,(Array<Qentem::Tags::TagBit> *)&local_a8);
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::Render
            ((TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_> *)
             &local_78.array_,(Array<Qentem::Tags::TagBit> *)&local_a8,
             (Value<char> *)&local_98.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_a8);
  QTest::IsEqual<Qentem::StringStream<char>,char[62]>
            (this,&local_48,
             (char (*) [62])"A&quot;&quot;BC&lt;&lt;DE&gt;&gt;FG&apos;&apos;HI&amp;&amp;GK",0x32a);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_68 = 0;
  local_a8.Natural = 0;
  uStack_a0 = 0;
  local_78.array_.storage_ = (Value<char> *)0x0;
  local_78._8_8_ = 0;
  local_60 = "{var:<\"&\'>}";
  local_58 = 0xb;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::parse
            ("{var:<\"&\'>}",0xb,(Array<Qentem::Tags::TagBit> *)&local_a8);
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::Render
            ((TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_> *)
             &local_78.array_,(Array<Qentem::Tags::TagBit> *)&local_a8,
             (Value<char> *)&local_98.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_a8);
  QTest::IsEqual<Qentem::StringStream<char>,char[32]>
            (this,&local_48,(char (*) [32])"{var:&lt;&quot;&amp;&apos;&gt;}",0x32d);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  Value<char>::reset((Value<char> *)&local_98.array_);
  local_88 = 0;
  Value<char>::reset((Value<char> *)&local_98.array_);
  local_88 = 2;
  this_00 = HArray<Qentem::String<char>,_Qentem::Value<char>_>::Get
                      ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)&local_98.array_,"abcd"
                       ,4);
  Value<char>::operator=(this_00," &lt; < &gt; > &amp; & &quot; \" &apos; \'");
  local_68 = 0;
  local_a8.Natural = 0;
  uStack_a0 = 0;
  local_78.array_.storage_ = (Value<char> *)0x0;
  local_78._8_8_ = 0;
  local_60 = "{var:abcd}";
  local_58 = 10;
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::parse
            ("{var:abcd}",10,(Array<Qentem::Tags::TagBit> *)&local_a8);
  TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::Render
            ((TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_> *)
             &local_78.array_,(Array<Qentem::Tags::TagBit> *)&local_a8,
             (Value<char> *)&local_98.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_a8);
  QTest::IsEqual<Qentem::StringStream<char>,char[61]>
            (this,&local_48,
             (char (*) [61])" &lt; &lt; &gt; &gt; &amp; &amp; &quot; &quot; &apos; &apos;",0x3dc);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  Value<char>::~Value((Value<char> *)&local_98.array_);
  pcVar3 = local_48.storage_;
  if (local_48.storage_ != (char *)0x0) {
    MemoryRecord::RemoveAllocation(local_48.storage_);
  }
  operator_delete(pcVar3);
  return;
}

Assistant:

static void TestVariableTag4(QTest &test) {
    StringStream<char> ss;
    Value<char>        value;

    value += R"(<)";
    value += R"(>)";
    value += R"(&)";
    value += R"(")";
    value += R"(')";
    value += R"(<>)";
    value += R"(<&)";
    value += R"(<&)";
    value += R"(>")";
    value += R"("')";
    value += R"(<">)";
    value += R"(<'>)";
    value += R"(<&>)";
    value += R"(&"&)";
    value += R"("'")";
    value += R"('<')";
    value += R"('&')";
    value += R"(<>&'")";
    value += R"('"<>&)";
    value += R"(<"&'>)";

    value += R"(<<<<<)";
    value += R"(>>>>>)";
    value += R"(&&&&&)";
    value += R"(""""")";
    value += R"(''''')";

    value += R"(A<)";
    value += R"(A>)";
    value += R"(A&)";
    value += R"(A")";
    value += R"(A')";
    value += R"(<A)";
    value += R"(>A)";
    value += R"(&A)";
    value += R"("A)";
    value += R"('A)";
    value += R"(A<A)";
    value += R"(A>A)";
    value += R"(A&A)";
    value += R"(A"A)";
    value += R"(A'A)";

    value += R"(AA<AA)";
    value += R"(AA>AA)";
    value += R"(AA&AA)";
    value += R"(AA"AA)";
    value += R"(AA'AA)";

    value += R"(AA<<<<AA)";
    value += R"(AA>>>>AA)";
    value += R"(AA&&&&AA)";
    value += R"(AA""""AA)";
    value += R"(AA''''AA)";

    value += R"(<A>B'C"D&E'F"G<H>I&G"K)";
    value += R"(AB"CD'EF<GH>IGK')";
    value += R"("ABC'DEF<GHI>GK<)";
    value += R"(A""BC<<DE>>FG''HI&&GK)";

    if (Config::AutoEscapeHTML) {
        test.IsEqual(Template::Render(R"({var:0})", value, ss), R"(&lt;)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:1})", value, ss), R"(&gt;)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:2})", value, ss), R"(&amp;)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:3})", value, ss), R"(&quot;)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:4})", value, ss), R"(&apos;)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:5})", value, ss), R"(&lt;&gt;)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:6})", value, ss), R"(&lt;&amp;)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:7})", value, ss), R"(&lt;&amp;)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:8})", value, ss), R"(&gt;&quot;)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:9})", value, ss), R"(&quot;&apos;)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:10})", value, ss), R"(&lt;&quot;&gt;)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:11})", value, ss), R"(&lt;&apos;&gt;)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:12})", value, ss), R"(&lt;&amp;&gt;)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:13})", value, ss), R"(&amp;&quot;&amp;)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:14})", value, ss), R"(&quot;&apos;&quot;)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:15})", value, ss), R"(&apos;&lt;&apos;)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:16})", value, ss), R"(&apos;&amp;&apos;)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:17})", value, ss), R"(&lt;&gt;&amp;&apos;&quot;)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:18})", value, ss), R"(&apos;&quot;&lt;&gt;&amp;)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:19})", value, ss), R"(&lt;&quot;&amp;&apos;&gt;)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:20})", value, ss), R"(&lt;&lt;&lt;&lt;&lt;)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:21})", value, ss), R"(&gt;&gt;&gt;&gt;&gt;)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:22})", value, ss), R"(&amp;&amp;&amp;&amp;&amp;)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:23})", value, ss), R"(&quot;&quot;&quot;&quot;&quot;)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:24})", value, ss), R"(&apos;&apos;&apos;&apos;&apos;)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:25})", value, ss), R"(A&lt;)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:26})", value, ss), R"(A&gt;)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:27})", value, ss), R"(A&amp;)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:28})", value, ss), R"(A&quot;)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:29})", value, ss), R"(A&apos;)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:30})", value, ss), R"(&lt;A)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:31})", value, ss), R"(&gt;A)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:32})", value, ss), R"(&amp;A)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:33})", value, ss), R"(&quot;A)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:34})", value, ss), R"(&apos;A)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:35})", value, ss), R"(A&lt;A)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:36})", value, ss), R"(A&gt;A)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:37})", value, ss), R"(A&amp;A)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:38})", value, ss), R"(A&quot;A)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:39})", value, ss), R"(A&apos;A)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:40})", value, ss), R"(AA&lt;AA)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:41})", value, ss), R"(AA&gt;AA)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:42})", value, ss), R"(AA&amp;AA)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:43})", value, ss), R"(AA&quot;AA)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:44})", value, ss), R"(AA&apos;AA)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:45})", value, ss), R"(AA&lt;&lt;&lt;&lt;AA)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:46})", value, ss), R"(AA&gt;&gt;&gt;&gt;AA)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:47})", value, ss), R"(AA&amp;&amp;&amp;&amp;AA)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:48})", value, ss), R"(AA&quot;&quot;&quot;&quot;AA)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:49})", value, ss), R"(AA&apos;&apos;&apos;&apos;AA)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:50})", value, ss),
                     R"(&lt;A&gt;B&apos;C&quot;D&amp;E&apos;F&quot;G&lt;H&gt;I&amp;G&quot;K)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:51})", value, ss), R"(AB&quot;CD&apos;EF&lt;GH&gt;IGK&apos;)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:52})", value, ss), R"(&quot;ABC&apos;DEF&lt;GHI&gt;GK&lt;)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:53})", value, ss),
                     R"(A&quot;&quot;BC&lt;&lt;DE&gt;&gt;FG&apos;&apos;HI&amp;&amp;GK)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:<"&'>})", value, ss), R"({var:&lt;&quot;&amp;&apos;&gt;})", __LINE__);
        ss.Clear();
    } else {
        test.IsEqual(Template::Render(R"({var:0})", value, ss), R"(<)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:1})", value, ss), R"(>)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:2})", value, ss), R"(&)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:3})", value, ss), R"(")", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:4})", value, ss), R"(')", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:5})", value, ss), R"(<>)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:6})", value, ss), R"(<&)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:7})", value, ss), R"(<&)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:8})", value, ss), R"(>")", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:9})", value, ss), R"("')", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:10})", value, ss), R"(<">)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:11})", value, ss), R"(<'>)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:12})", value, ss), R"(<&>)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:13})", value, ss), R"(&"&)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:14})", value, ss), R"("'")", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:15})", value, ss), R"('<')", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:16})", value, ss), R"('&')", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:17})", value, ss), R"(<>&'")", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:18})", value, ss), R"('"<>&)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:19})", value, ss), R"(<"&'>)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:20})", value, ss), R"(<<<<<)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:21})", value, ss), R"(>>>>>)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:22})", value, ss), R"(&&&&&)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:23})", value, ss), R"(""""")", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:24})", value, ss), R"(''''')", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:25})", value, ss), R"(A<)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:26})", value, ss), R"(A>)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:27})", value, ss), R"(A&)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:28})", value, ss), R"(A")", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:29})", value, ss), R"(A')", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:30})", value, ss), R"(<A)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:31})", value, ss), R"(>A)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:32})", value, ss), R"(&A)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:33})", value, ss), R"("A)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:34})", value, ss), R"('A)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:35})", value, ss), R"(A<A)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:36})", value, ss), R"(A>A)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:37})", value, ss), R"(A&A)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:38})", value, ss), R"(A"A)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:39})", value, ss), R"(A'A)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:40})", value, ss), R"(AA<AA)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:41})", value, ss), R"(AA>AA)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:42})", value, ss), R"(AA&AA)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:43})", value, ss), R"(AA"AA)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:44})", value, ss), R"(AA'AA)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:45})", value, ss), R"(AA<<<<AA)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:46})", value, ss), R"(AA>>>>AA)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:47})", value, ss), R"(AA&&&&AA)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:48})", value, ss), R"(AA""""AA)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:49})", value, ss), R"(AA''''AA)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:50})", value, ss), R"(<A>B'C"D&E'F"G<H>I&G"K)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:51})", value, ss), R"(AB"CD'EF<GH>IGK')", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:52})", value, ss), R"("ABC'DEF<GHI>GK<)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:53})", value, ss), R"(A""BC<<DE>>FG''HI&&GK)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:<"&'>})", value, ss), R"({var:<"&'>})", __LINE__);
        ss.Clear();
    }

    if (Config::AutoEscapeHTML) {
        value.Reset();

        value[R"(abcd)"] = R"( &lt; < &gt; > &amp; & &quot; " &apos; ')";

        test.IsEqual(Template::Render(R"({var:abcd})", value, ss),
                     R"( &lt; &lt; &gt; &gt; &amp; &amp; &quot; &quot; &apos; &apos;)", __LINE__);
        ss.Clear();
    }
}